

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

VkGeometryFlagsKHR Diligent::GeometryFlagsToVkGeometryFlags(RAYTRACING_GEOMETRY_FLAGS Flags)

{
  RAYTRACING_GEOMETRY_FLAGS RVar1;
  uint uVar2;
  string msg;
  string local_50;
  
  uVar2 = 0;
  while (Flags != RAYTRACING_GEOMETRY_FLAG_NONE) {
    RVar1 = -Flags & Flags;
    Flags = Flags ^ RVar1;
    if (RVar1 == RAYTRACING_GEOMETRY_FLAG_LAST) {
      uVar2 = uVar2 | 2;
    }
    else if (RVar1 == RAYTRACING_GEOMETRY_FLAG_OPAQUE) {
      uVar2 = uVar2 | 1;
    }
    else {
      FormatString<char[22]>(&local_50,(char (*) [22])"unknown geometry flag");
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"GeometryFlagsToVkGeometryFlags",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x6f0);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return uVar2;
}

Assistant:

VkGeometryFlagsKHR GeometryFlagsToVkGeometryFlags(RAYTRACING_GEOMETRY_FLAGS Flags)
{
    static_assert(RAYTRACING_GEOMETRY_FLAG_LAST == RAYTRACING_GEOMETRY_FLAG_NO_DUPLICATE_ANY_HIT_INVOCATION,
                  "Please update the switch below to handle the new ray tracing geometry flag");

    VkGeometryFlagsKHR Result = 0;
    while (Flags != RAYTRACING_GEOMETRY_FLAG_NONE)
    {
        RAYTRACING_GEOMETRY_FLAGS FlagBit = ExtractLSB(Flags);
        switch (FlagBit)
        {
            // clang-format off
            case RAYTRACING_GEOMETRY_FLAG_OPAQUE:                          Result |= VK_GEOMETRY_OPAQUE_BIT_KHR;                          break;
            case RAYTRACING_GEOMETRY_FLAG_NO_DUPLICATE_ANY_HIT_INVOCATION: Result |= VK_GEOMETRY_NO_DUPLICATE_ANY_HIT_INVOCATION_BIT_KHR; break;
            // clang-format on
            default: UNEXPECTED("unknown geometry flag");
        }
    }
    return Result;
}